

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O2

void av1_dropout_qcoeff(MACROBLOCK *mb,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
                       int qindex)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (0xffffff8e < qindex - 0x81U) {
    iVar2 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    iVar1 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    uVar3 = 2;
    if (0x3f < (uint)qindex) {
      uVar3 = (uint)qindex >> 5;
    }
    iVar1 = 0x20;
    if (iVar2 < 0x20) {
      iVar1 = iVar2;
    }
    iVar2 = 0x10;
    if (0x10 < iVar1) {
      iVar2 = iVar1;
    }
    av1_dropout_qcoeff_num(mb,plane,block,tx_size,tx_type,iVar2 * uVar3,iVar2 * uVar3);
  }
  return;
}

Assistant:

void av1_dropout_qcoeff(MACROBLOCK *mb, int plane, int block, TX_SIZE tx_size,
                        TX_TYPE tx_type, int qindex) {
  const int tx_width = tx_size_wide[tx_size];
  const int tx_height = tx_size_high[tx_size];

  // Early return if `qindex` is out of range.
  if (qindex > DROPOUT_Q_MAX || qindex < DROPOUT_Q_MIN) {
    return;
  }

  // Compute number of zeros used for dropout judgement.
  const int base_size = AOMMAX(tx_width, tx_height);
  const int multiplier = CLIP(qindex / DROPOUT_MULTIPLIER_Q_BASE,
                              DROPOUT_MULTIPLIER_MIN, DROPOUT_MULTIPLIER_MAX);
  const int dropout_num_before =
      multiplier *
      CLIP(base_size, DROPOUT_BEFORE_BASE_MIN, DROPOUT_BEFORE_BASE_MAX);
  const int dropout_num_after =
      multiplier *
      CLIP(base_size, DROPOUT_AFTER_BASE_MIN, DROPOUT_AFTER_BASE_MAX);

  av1_dropout_qcoeff_num(mb, plane, block, tx_size, tx_type, dropout_num_before,
                         dropout_num_after);
}